

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O3

void __thiscall
llbuild::basic::StringList::StringList<std::__cxx11::string>
          (StringList *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  pointer pcVar1;
  long *plVar2;
  size_t sVar3;
  char *__dest;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  size_type local_38;
  
  local_38 = values.Length;
  pbVar6 = values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  if (local_38 == 0) {
    __dest = (char *)operator_new__(1);
    this->contents = __dest;
  }
  else {
    pbVar5 = pbVar6 + local_38;
    pbVar7 = pbVar6;
    do {
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,pcVar1 + pbVar7->_M_string_length);
      this->size = local_50 + this->size + 1;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar5);
    __dest = (char *)operator_new__(this->size + 1);
    this->contents = __dest;
    if (local_38 != 0) {
      do {
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar1,pcVar1 + pbVar6->_M_string_length);
        lVar4 = std::__cxx11::string::find((char)&local_58,0);
        sVar3 = local_50;
        plVar2 = local_58;
        if (lVar4 != -1) {
          __assert_fail("value.find(\'\\0\') == StringRef::npos",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                        ,0x40,
                        "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = std::basic_string<char>]"
                       );
        }
        memcpy(__dest,local_58,local_50);
        __dest[sVar3] = '\0';
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        __dest = __dest + sVar3 + 1;
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar5);
    }
  }
  *__dest = '\0';
  return;
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }